

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O1

void nn_msgqueue_term(nn_msgqueue *self)

{
  nn_msgqueue_chunk *ptr;
  int iVar1;
  nn_msg msg;
  nn_msg local_70;
  
  iVar1 = nn_msgqueue_recv(self,&local_70);
  if (iVar1 != -0xb) {
    do {
      if (iVar1 < 0) {
        nn_msgqueue_term_cold_1();
        goto LAB_0013d690;
      }
      nn_msg_term(&local_70);
      iVar1 = nn_msgqueue_recv(self,&local_70);
    } while (iVar1 != -0xb);
  }
  ptr = (self->in).chunk;
  if (ptr == (self->out).chunk) {
    nn_free(ptr);
    if (self->cache != (nn_msgqueue_chunk *)0x0) {
      nn_free(self->cache);
    }
    return;
  }
LAB_0013d690:
  nn_msgqueue_term_cold_2();
}

Assistant:

void nn_msgqueue_term (struct nn_msgqueue *self)
{
    int rc;
    struct nn_msg msg;

    /*  Deallocate messages in the pipe. */
    while (1) {
        rc = nn_msgqueue_recv (self, &msg);
        if (rc == -EAGAIN)
            break;
        errnum_assert (rc >= 0, -rc);
        nn_msg_term (&msg);
    }

    /*  There are no more messages in the pipe so there's at most one chunk
        in the queue. Deallocate it. */
    nn_assert (self->in.chunk == self->out.chunk);
    nn_free (self->in.chunk);

    /*  Deallocate the cached chunk, if any. */
    if (self->cache)
        nn_free (self->cache);
}